

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O1

void __thiscall
flatbuffers::dart::DartGenerator::GenStruct
          (DartGenerator *this,StructDef *struct_def,namespace_code_map *namespace_code)

{
  IdlNamer *pIVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  FieldDef *pFVar4;
  DartGenerator *this_00;
  mapped_type *code;
  long *plVar5;
  size_type *psVar6;
  long *plVar7;
  pointer ppVar8;
  pointer ppFVar9;
  pointer ppFVar10;
  vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
  non_deprecated_fields;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> builder_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> object_builder_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> reader_name;
  string builder_code;
  string reader_code;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  undefined1 local_188 [24];
  long lStack_170;
  key_type local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  long *local_120;
  long local_118;
  long local_110;
  long lStack_108;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  IdlNamer *local_80;
  DartGenerator *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((struct_def->super_Definition).generated == false) {
    pIVar1 = &this->namer_;
    (*(this->namer_).super_Namer._vptr_Namer[10])
              (&local_160,pIVar1,(struct_def->super_Definition).defined_namespace);
    code = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](namespace_code,&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    (*(pIVar1->super_Namer)._vptr_Namer[0xf])(&local_160,pIVar1,struct_def);
    GenDocComment(&(struct_def->super_Definition).doc_comment,"",code);
    std::operator+(&local_140,"_",&local_160);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_140);
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_e0.field_2._M_allocated_capacity = *psVar6;
      local_e0.field_2._8_8_ = plVar5[3];
    }
    else {
      local_e0.field_2._M_allocated_capacity = *psVar6;
      local_e0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_e0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_140,local_160._M_dataplus._M_p,
               local_160._M_dataplus._M_p + local_160._M_string_length);
    std::__cxx11::string::append((char *)&local_140);
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_100,local_160._M_dataplus._M_p,
               local_160._M_dataplus._M_p + local_160._M_string_length);
    std::__cxx11::string::append((char *)&local_100);
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    local_c0._M_string_length = 0;
    local_c0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_1a8,"class ",&local_160);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_1a8);
    paVar2 = &local_1c8.field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_1c8.field_2._M_allocated_capacity = *psVar6;
      local_1c8.field_2._8_8_ = plVar5[3];
      local_1c8._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_1c8.field_2._M_allocated_capacity = *psVar6;
      local_1c8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_1c8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code,(ulong)local_1c8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_1a8,"  ",&local_160);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_1a8);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_1c8.field_2._M_allocated_capacity = *psVar6;
      local_1c8.field_2._8_8_ = plVar5[3];
      local_1c8._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_1c8.field_2._M_allocated_capacity = *psVar6;
      local_1c8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_1c8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code,(ulong)local_1c8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    local_80 = pIVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    paVar3 = &local_1a8.field_2;
    local_78 = this;
    if (struct_def->fixed == false) {
      std::operator+(&local_1a8,"  factory ",&local_160);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_1a8);
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_1c8.field_2._M_allocated_capacity = *psVar6;
        local_1c8.field_2._8_8_ = plVar5[3];
        local_1c8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_1c8.field_2._M_allocated_capacity = *psVar6;
        local_1c8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_1c8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)code,(ulong)local_1c8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != paVar2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != paVar3) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_1a8,"    final rootRef = ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &_kFb_abi_cxx11_);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_1a8);
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_1c8.field_2._M_allocated_capacity = *psVar6;
        local_1c8.field_2._8_8_ = plVar5[3];
        local_1c8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_1c8.field_2._M_allocated_capacity = *psVar6;
        local_1c8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_1c8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)code,(ulong)local_1c8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != paVar2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != paVar3) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)code);
      std::__cxx11::string::append((char *)code);
    }
    std::__cxx11::string::append((char *)code);
    std::operator+(&local_50,"  static const ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_kFb_abi_cxx11_);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_60 = *plVar7;
      lStack_58 = plVar5[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar7;
      local_70 = (long *)*plVar5;
    }
    local_68 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_70,(ulong)local_160._M_dataplus._M_p);
    ppVar8 = (pointer)(plVar5 + 2);
    if ((pointer)*plVar5 == ppVar8) {
      local_188._16_8_ = *(undefined8 *)ppVar8;
      lStack_170 = plVar5[3];
      local_188._0_8_ = (pointer)(local_188 + 0x10);
    }
    else {
      local_188._16_8_ = *(undefined8 *)ppVar8;
      local_188._0_8_ = (pointer)*plVar5;
    }
    local_188._8_8_ = plVar5[1];
    *plVar5 = (long)ppVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append(local_188);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_110 = *plVar7;
      lStack_108 = plVar5[3];
      local_120 = &local_110;
    }
    else {
      local_110 = *plVar7;
      local_120 = (long *)*plVar5;
    }
    local_118 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_120,(ulong)local_e0._M_dataplus._M_p);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_1a8.field_2._M_allocated_capacity = *psVar6;
      local_1a8.field_2._8_8_ = plVar5[3];
      local_1a8._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_1a8.field_2._M_allocated_capacity = *psVar6;
      local_1a8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_1a8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_1a8);
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_1c8.field_2._M_allocated_capacity = *psVar6;
      local_1c8.field_2._8_8_ = plVar5[3];
    }
    else {
      local_1c8.field_2._M_allocated_capacity = *psVar6;
      local_1c8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_1c8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code,(ulong)local_1c8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar3) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    if ((pointer)local_188._0_8_ != (pointer)(local_188 + 0x10)) {
      operator_delete((void *)local_188._0_8_,(ulong)((long)(int *)local_188._16_8_ + 1));
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_1a8,"  final ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_kFb_abi_cxx11_);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_1a8);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_1c8.field_2._M_allocated_capacity = *psVar6;
      local_1c8.field_2._8_8_ = plVar5[3];
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    }
    else {
      local_1c8.field_2._M_allocated_capacity = *psVar6;
      local_1c8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_1c8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code,(ulong)local_1c8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar3) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)code);
    local_188._0_8_ = (pointer)0x0;
    local_188._8_8_ = (pair<int,_flatbuffers::FieldDef_*> *)0x0;
    local_188._16_8_ = (pair<int,_flatbuffers::FieldDef_*> *)0x0;
    ppFVar9 = (struct_def->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppFVar9 !=
        (struct_def->fields).vec.
        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      ppFVar10 = ppFVar9;
      do {
        pFVar4 = *ppFVar9;
        if (pFVar4->deprecated == false) {
          local_1c8._M_dataplus._M_p._0_4_ =
               (int)((ulong)((long)ppFVar10 -
                            (long)(struct_def->fields).vec.
                                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
          local_1c8._M_string_length = (size_type)pFVar4;
          if (local_188._8_8_ == local_188._16_8_) {
            std::
            vector<std::pair<int,flatbuffers::FieldDef*>,std::allocator<std::pair<int,flatbuffers::FieldDef*>>>
            ::_M_realloc_insert<std::pair<int,flatbuffers::FieldDef*>>
                      ((vector<std::pair<int,flatbuffers::FieldDef*>,std::allocator<std::pair<int,flatbuffers::FieldDef*>>>
                        *)local_188,(iterator)local_188._8_8_,
                       (pair<int,_flatbuffers::FieldDef_*> *)&local_1c8);
          }
          else {
            *(pointer *)local_188._8_8_ = local_1c8._M_dataplus._M_p;
            *(FieldDef **)(local_188._8_8_ + 8) = pFVar4;
            local_188._8_8_ = local_188._8_8_ + 0x10;
          }
        }
        ppFVar9 = ppFVar9 + 1;
        ppFVar10 = ppFVar10 + 1;
      } while (ppFVar9 !=
               (struct_def->fields).vec.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    this_00 = local_78;
    GenImplementationGetters
              (local_78,struct_def,
               (vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                *)local_188,code);
    paVar2 = &local_1c8.field_2;
    if ((((this_00->super_BaseGenerator).parser_)->opts).generate_object_based_api == true) {
      GenStructObjectAPIUnpack_abi_cxx11_
                (&local_1a8,this_00,struct_def,
                 (vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                  *)local_188);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_1a8,0,(char *)0x0,0x375e21);
      pIVar1 = local_80;
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_1c8.field_2._M_allocated_capacity = *psVar6;
        local_1c8.field_2._8_8_ = plVar5[3];
        local_1c8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_1c8.field_2._M_allocated_capacity = *psVar6;
        local_1c8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_1c8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)code,(ulong)local_1c8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != paVar2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
      (*(pIVar1->super_Namer)._vptr_Namer[0x11])(&local_120,pIVar1,struct_def);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,0x36f68d);
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_1a8.field_2._M_allocated_capacity = *psVar6;
        local_1a8.field_2._8_8_ = plVar5[3];
      }
      else {
        local_1a8.field_2._M_allocated_capacity = *psVar6;
        local_1a8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_1a8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_1a8);
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_1c8.field_2._M_allocated_capacity = *psVar6;
        local_1c8.field_2._8_8_ = plVar5[3];
        local_1c8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_1c8.field_2._M_allocated_capacity = *psVar6;
        local_1c8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_1c8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)code,(ulong)local_1c8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != paVar2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
      if (local_120 != &local_110) {
        operator_delete(local_120,local_110 + 1);
      }
      std::__cxx11::string::append((char *)code);
      std::__cxx11::string::append((char *)code);
      std::__cxx11::string::append((char *)code);
    }
    std::__cxx11::string::append((char *)code);
    if ((((this_00->super_BaseGenerator).parser_)->opts).generate_object_based_api == true) {
      GenStructObjectAPI_abi_cxx11_
                (&local_1c8,this_00,struct_def,
                 (vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                  *)local_188);
      std::__cxx11::string::_M_append((char *)code,(ulong)local_1c8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != paVar2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
    }
    GenReader(this_00,struct_def,&local_e0,&local_a0);
    GenBuilder(this_00,struct_def,
               (vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                *)local_188,&local_140,&local_c0);
    GenObjectBuilder(this_00,struct_def,
                     (vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                      *)local_188,&local_100,&local_c0);
    std::__cxx11::string::_M_append((char *)code,(ulong)local_a0._M_dataplus._M_p);
    std::__cxx11::string::_M_append((char *)code,(ulong)local_c0._M_dataplus._M_p);
    if ((pointer)local_188._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_188._0_8_,local_188._16_8_ - local_188._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                               local_c0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,
                      CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                               local_a0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void GenStruct(const StructDef &struct_def,
                 namespace_code_map &namespace_code) {
    if (struct_def.generated) return;

    std::string &code =
        namespace_code[namer_.Namespace(*struct_def.defined_namespace)];

    const auto &struct_type = namer_.Type(struct_def);

    // Emit constructor

    GenDocComment(struct_def.doc_comment, "", code);

    auto reader_name = "_" + struct_type + "Reader";
    auto builder_name = struct_type + "Builder";
    auto object_builder_name = struct_type + "ObjectBuilder";

    std::string reader_code, builder_code;

    code += "class " + struct_type + " {\n";

    code += "  " + struct_type + "._(this._bc, this._bcOffset);\n";
    if (!struct_def.fixed) {
      code += "  factory " + struct_type + "(List<int> bytes) {\n";
      code +=
          "    final rootRef = " + _kFb + ".BufferContext.fromBytes(bytes);\n";
      code += "    return reader.read(rootRef, 0);\n";
      code += "  }\n";
    }

    code += "\n";
    code += "  static const " + _kFb + ".Reader<" + struct_type +
            "> reader = " + reader_name + "();\n\n";

    code += "  final " + _kFb + ".BufferContext _bc;\n";
    code += "  final int _bcOffset;\n\n";

    std::vector<std::pair<int, FieldDef *>> non_deprecated_fields;
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      FieldDef &field = **it;
      if (field.deprecated) continue;
      auto offset = static_cast<int>(it - struct_def.fields.vec.begin());
      non_deprecated_fields.push_back(std::make_pair(offset, &field));
    }

    GenImplementationGetters(struct_def, non_deprecated_fields, code);

    if (parser_.opts.generate_object_based_api) {
      code +=
          "\n" + GenStructObjectAPIUnpack(struct_def, non_deprecated_fields);

      code += "\n  static int pack(fb.Builder fbBuilder, " +
              namer_.ObjectType(struct_def) + "? object) {\n";
      code += "    if (object == null) return 0;\n";
      code += "    return object.pack(fbBuilder);\n";
      code += "  }\n";
    }

    code += "}\n\n";

    if (parser_.opts.generate_object_based_api) {
      code += GenStructObjectAPI(struct_def, non_deprecated_fields);
    }

    GenReader(struct_def, reader_name, reader_code);
    GenBuilder(struct_def, non_deprecated_fields, builder_name, builder_code);
    GenObjectBuilder(struct_def, non_deprecated_fields, object_builder_name,
                     builder_code);

    code += reader_code;
    code += builder_code;
  }